

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ExclusiveJoinPromiseNode::Branch::Branch
          (Branch *this,ExclusiveJoinPromiseNode *joinNode,OwnPromiseNode dependencyParam,
          SourceLocation location)

{
  PromiseNode *pPVar1;
  
  Event::Event(&this->super_Event,location);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_0036d040;
  this->joinNode = joinNode;
  (this->dependency).ptr =
       (PromiseNode *)((dependencyParam.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember;
  ((dependencyParam.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)0x0;
  pPVar1 = (this->dependency).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar1,&this->dependency);
  pPVar1 = (this->dependency).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,this);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::Branch::Branch(
    ExclusiveJoinPromiseNode& joinNode, OwnPromiseNode dependencyParam, SourceLocation location)
    : Event(location), joinNode(joinNode), dependency(kj::mv(dependencyParam)) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}